

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::basic_buffer<char>::append<char>(basic_buffer<char> *this,char *begin,char *end)

{
  type tVar1;
  size_t sVar2;
  char *pcVar3;
  size_t new_size;
  char *end_local;
  char *begin_local;
  basic_buffer<char> *this_local;
  
  sVar2 = this->size_;
  tVar1 = to_unsigned<long>((long)end - (long)begin);
  sVar2 = sVar2 + tVar1;
  reserve(this,sVar2);
  pcVar3 = make_checked<char>(this->ptr_,this->capacity_);
  std::uninitialized_copy<char_const*,char*>(begin,end,pcVar3 + this->size_);
  this->size_ = sVar2;
  return;
}

Assistant:

void basic_buffer<T>::append(const U *begin, const U *end) {
  std::size_t new_size = size_ + internal::to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end,
                          internal::make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}